

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ExpandDimsLayerParams::ExpandDimsLayerParams
          (ExpandDimsLayerParams *this,ExpandDimsLayerParams *from)

{
  ExpandDimsLayerParams *from_local;
  ExpandDimsLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ExpandDimsLayerParams_006f73d0;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->axes_,&from->axes_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

ExpandDimsLayerParams::ExpandDimsLayerParams(const ExpandDimsLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      axes_(from.axes_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ExpandDimsLayerParams)
}